

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient> *this,
          void *pointer)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  void *pvVar10;
  undefined8 *puVar11;
  long lVar12;
  undefined8 *puVar13;
  Fault local_60;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  
  if (pointer != (void *)0x0) {
    _kjCondition.left = (uint *)((long)pointer + 0x14);
    _kjCondition.result = *(int *)((long)pointer + 0x14) == 0;
    _kjCondition.right = 0;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[90]>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x195b,FAILED,"concurrentRequests == 0",
                 "_kjCondition,\"ConcurrencyLimitingHttpClient getting destroyed when concurrent requests \" \"are still active\""
                 ,&_kjCondition,
                 (char (*) [90])
                 "ConcurrencyLimitingHttpClient getting destroyed when concurrent requests are still active"
                );
      Debug::Fault::fatal(&local_60);
    }
    puVar13 = *(undefined8 **)((long)pointer + 0x38);
    puVar1 = *(undefined8 **)((long)pointer + 0x48);
    plVar2 = *(long **)((long)pointer + 0x50);
    puVar3 = *(undefined8 **)((long)pointer + 0x58);
    puVar11 = *(undefined8 **)((long)pointer + 0x60);
    plVar4 = *(long **)((long)pointer + 0x70);
    plVar8 = plVar2;
    while (plVar8 = plVar8 + 1, plVar8 < plVar4) {
      lVar5 = *plVar8;
      lVar12 = 0;
      do {
        plVar6 = *(long **)(lVar5 + 8 + lVar12);
        if (plVar6 != (long *)0x0) {
          *(undefined8 *)(lVar5 + 8 + lVar12) = 0;
          (**(code **)**(undefined8 **)(lVar5 + lVar12))
                    (*(undefined8 **)(lVar5 + lVar12),(long)plVar6 + *(long *)(*plVar6 + -0x10));
        }
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x200);
    }
    if (plVar2 == plVar4) {
      for (; puVar13 != puVar3; puVar13 = puVar13 + 2) {
        plVar2 = (long *)puVar13[1];
        if (plVar2 != (long *)0x0) {
          puVar13[1] = 0;
          (*(code *)**(undefined8 **)*puVar13)
                    ((undefined8 *)*puVar13,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    else {
      for (; puVar13 != puVar1; puVar13 = puVar13 + 2) {
        plVar2 = (long *)puVar13[1];
        if (plVar2 != (long *)0x0) {
          puVar13[1] = 0;
          (*(code *)**(undefined8 **)*puVar13)
                    ((undefined8 *)*puVar13,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
      for (; puVar11 != puVar3; puVar11 = puVar11 + 2) {
        plVar2 = (long *)puVar11[1];
        if (plVar2 != (long *)0x0) {
          puVar11[1] = 0;
          (*(code *)**(undefined8 **)*puVar11)
                    ((undefined8 *)*puVar11,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    pvVar10 = *(void **)((long)pointer + 0x28);
    if (pvVar10 != (void *)0x0) {
      uVar7 = *(ulong *)((long)pointer + 0x70);
      if (*(ulong *)((long)pointer + 0x50) < uVar7 + 8) {
        uVar9 = *(ulong *)((long)pointer + 0x50) - 8;
        do {
          puVar13 = (undefined8 *)(uVar9 + 8);
          uVar9 = uVar9 + 8;
          operator_delete((void *)*puVar13,0x200);
        } while (uVar9 < uVar7);
        pvVar10 = *(void **)((long)pointer + 0x28);
      }
      operator_delete(pvVar10,*(long *)((long)pointer + 0x30) << 3);
    }
    plVar2 = *(long **)((long)pointer + 0x20);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x20) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
  }
  operator_delete(pointer,0x78);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }